

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

bool __thiscall QSQLiteResult::execBatch(QSQLiteResult *this,bool arrayBind)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  qsizetype qVar5;
  char cVar6;
  bool bVar7;
  long lVar8;
  QHash<QString,_QList<int>_> *this_00;
  ulong uVar9;
  long in_FS_OFFSET;
  piter local_a8;
  QScopedValueRollback<QHash<QString,_QList<int>_>_> local_98;
  QArrayDataPointer<QVariant> local_88;
  QArrayDataPointer<QVariant> local_70;
  QScopedValueRollback<QList<QVariant>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  local_58.oldValue.d.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.oldValue.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.varRef = (QList<QVariant> *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.oldValue.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QScopedValueRollback<QList<QVariant>_>::QScopedValueRollback
            (&local_58,(QList<QVariant> *)(lVar2 + 0x60));
  local_70.d = *(Data **)(lVar2 + 0x60);
  local_70.ptr = *(QVariant **)(lVar2 + 0x68);
  local_70.size = *(long *)(lVar2 + 0x70);
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_70.size == 0) {
    bVar7 = false;
  }
  else {
    this_00 = (QHash<QString,_QList<int>_> *)(lVar2 + 0x78);
    uVar9 = 0;
    do {
      QVariant::toList();
      qVar5 = local_88.size;
      QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_88);
      bVar7 = (ulong)qVar5 <= uVar9;
      if ((ulong)qVar5 <= uVar9) {
        bVar7 = true;
        break;
      }
      QList<QVariant>::clear((QList<QVariant> *)(lVar2 + 0x60));
      local_98.oldValue.d = this_00->d;
      if ((local_98.oldValue.d != (Data *)0x0) && (*(int *)local_98.oldValue.d != -1)) {
        LOCK();
        *(int *)local_98.oldValue.d = *(int *)local_98.oldValue.d + 1;
        UNLOCK();
      }
      local_a8.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d = (Data<QHashPrivate::Node<QString,_QList<int>_>_> *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.varRef = this_00;
      local_a8 = (piter)QHash<QString,_QList<int>_>::constBegin(this_00);
      while( true ) {
        if (local_a8.d == (Data<QHashPrivate::Node<QString,_QList<int>_>_> *)0x0 &&
            local_a8.bucket == 0) break;
        lVar3 = *(long *)(local_a8.d + 0x20);
        lVar8 = (local_a8.bucket >> 7) * 0x90;
        lVar4 = *(long *)(lVar3 + 0x80 + lVar8);
        bVar1 = *(byte *)((ulong)((uint)local_a8.bucket & 0x7f) + lVar3 + lVar8);
        QVariant::toList();
        (**(code **)(*(long *)this + 0x68))(this,lVar4 + (ulong)bVar1 * 0x30,local_88.ptr + uVar9,1)
        ;
        QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_88);
        QHashPrivate::iterator<QHashPrivate::Node<QString,_QList<int>_>_>::operator++(&local_a8);
      }
      cVar6 = (**(code **)(*(long *)this + 0x48))(this);
      QScopedValueRollback<QHash<QString,_QList<int>_>_>::~QScopedValueRollback(&local_98);
      uVar9 = uVar9 + 1;
    } while (cVar6 != '\0');
  }
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_70);
  QScopedValueRollback<QList<QVariant>_>::~QScopedValueRollback(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QSQLiteResult::execBatch(bool arrayBind)
{
    Q_UNUSED(arrayBind);
    Q_D(QSqlResult);
    QScopedValueRollback<QList<QVariant>> valuesScope(d->values);
    QList<QVariant> values = d->values;
    if (values.size() == 0)
        return false;

    for (int i = 0; i < values.at(0).toList().size(); ++i) {
        d->values.clear();
        QScopedValueRollback<QHash<QString, QList<int>>> indexesScope(d->indexes);
        auto it = d->indexes.constBegin();
        while (it != d->indexes.constEnd()) {
            bindValue(it.key(), values.at(it.value().first()).toList().at(i), QSql::In);
            ++it;
        }
        if (!exec())
            return false;
    }
    return true;
}